

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::deliverMessage(CommonCore *this,ActionMessage *message)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  uint uVar3;
  GlobalHandle fed_id;
  bool bVar4;
  BasicHandleInfo *handle;
  _func_int *UNRECOVERED_JUMPTABLE;
  FederateState *this_00;
  string *psVar5;
  iterator iVar6;
  uint *puVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  ulong uVar10;
  string_view name;
  
  iVar2 = (message->dest_id).gid;
  if (message->messageAction == cmd_send_message) {
    if (iVar2 == 0) {
      psVar5 = ActionMessage::getString_abi_cxx11_(message,0);
      name._M_str = (psVar5->_M_dataplus)._M_p;
      name._M_len = psVar5->_M_string_length;
      handle = HandleManager::getInterfaceHandle(&this->loopHandles,name,ENDPOINT);
    }
    else {
      fed_id.fed_id.gid = (message->dest_id).gid;
      fed_id.handle.hid = (message->dest_handle).hid;
      handle = HandleManager::findHandle(&this->loopHandles,fed_id);
    }
    if (handle != (BasicHandleInfo *)0x0) {
      if (((handle->flags & 0x2000) != 0) &&
         (bVar4 = FilterFederate::destinationProcessMessage(this->filterFed,message,handle), !bVar4)
         ) {
        return;
      }
      if ((message->dest_id).gid == 0) {
        (message->dest_id).gid = (handle->handle).fed_id.gid;
        (message->dest_handle).hid = (handle->handle).handle.hid;
      }
      this_00 = getFederateCore(this,(GlobalFederateId)(handle->handle).fed_id.gid);
      if (this_00 == (FederateState *)0x0) {
        if (((handle->handle).fed_id.gid == (this->translatorFedID)._M_i.gid) &&
           (this->translatorFed != (TranslatorFederate *)0x0)) {
          TranslatorFederate::handleMessage(this->translatorFed,message);
          return;
        }
        return;
      }
      FederateState::addAction(this_00,message);
      return;
    }
    psVar5 = ActionMessage::getString_abi_cxx11_(message,0);
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->knownExternalEndpoints)._M_h,(key_type *)psVar5);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_true>
        ._M_cur == (__node_type *)0x0) {
      UNRECOVERED_JUMPTABLE = (this->super_Core)._vptr_Core[0x6b];
      uVar10 = 0;
      goto LAB_002a3499;
    }
    uVar3 = *(uint *)((long)iVar6.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_true>
                            ._M_cur + 0x28);
  }
  else {
    p_Var9 = (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    puVar7 = &parent_route_id;
    if (p_Var9 != (_Base_ptr)0x0) {
      p_Var1 = &(this->routing_table)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var1->_M_header;
      do {
        if (iVar2 <= (int)p_Var9[1]._M_color) {
          p_Var8 = p_Var9;
        }
        p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < iVar2];
      } while (p_Var9 != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var8 != p_Var1) {
        puVar7 = &parent_route_id;
        if ((int)p_Var8[1]._M_color <= iVar2) {
          puVar7 = (uint *)&p_Var8[1].field_0x4;
        }
      }
    }
    uVar3 = *puVar7;
  }
  uVar10 = (ulong)uVar3;
  UNRECOVERED_JUMPTABLE = (this->super_Core)._vptr_Core[0x6b];
LAB_002a3499:
  (*UNRECOVERED_JUMPTABLE)(this,uVar10,message);
  return;
}

Assistant:

void CommonCore::deliverMessage(ActionMessage& message)
{
    switch (message.action()) {
        case CMD_SEND_MESSAGE: {
            // Find the destination endpoint
            auto* localP = (message.dest_id == parent_broker_id) ?
                loopHandles.getInterfaceHandle(message.getString(targetStringLoc),
                                               InterfaceType::ENDPOINT) :
                loopHandles.findHandle(message.getDest());
            if (localP == nullptr) {
                auto kfnd = knownExternalEndpoints.find(message.getString(targetStringLoc));
                if (kfnd != knownExternalEndpoints.end()) {  // destination is known
                    transmit(kfnd->second, message);
                } else {
                    transmit(parent_route_id, message);
                }
                return;
            }
            // now we deal with local processing
            if (checkActionFlag(*localP, has_dest_filter_flag)) {
                if (!filterFed->destinationProcessMessage(message, localP)) {
                    return;
                }
            }
            if (message.dest_id == parent_broker_id) {
                message.dest_id = localP->getFederateId();
                message.dest_handle = localP->getInterfaceHandle();
            }

            auto* fed = getFederateCore(localP->getFederateId());
            if (fed != nullptr) {
                fed->addAction(std::move(message));
            } else if (localP->getFederateId() == translatorFedID) {
                if (translatorFed != nullptr) {
                    translatorFed->handleMessage(message);
                }
            }
            // else we just drop it as that is a weird condition so ignore it
        } break;
        case CMD_SEND_FOR_FILTER:
        case CMD_SEND_FOR_FILTER_AND_RETURN:
        case CMD_SEND_FOR_DEST_FILTER_AND_RETURN:
        case CMD_FILTER_RESULT:
        case CMD_DEST_FILTER_RESULT:
        case CMD_NULL_MESSAGE:
        case CMD_NULL_DEST_MESSAGE:
        default: {
            transmit(getRoute(message.dest_id), message);
        } break;
    }
}